

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_msg.c
# Opt level: O0

int ssl_hs_is_proper_fragment(mbedtls_ssl_context *ssl)

{
  int iVar1;
  mbedtls_ssl_context *ssl_local;
  
  if (((ssl->in_hslen <= ssl->in_msglen) && (iVar1 = memcmp(ssl->in_msg + 6,"",3), iVar1 == 0)) &&
     (iVar1 = memcmp(ssl->in_msg + 9,ssl->in_msg + 1,3), iVar1 == 0)) {
    return 0;
  }
  return 1;
}

Assistant:

MBEDTLS_CHECK_RETURN_CRITICAL
static int ssl_hs_is_proper_fragment(mbedtls_ssl_context *ssl)
{
    if (ssl->in_msglen < ssl->in_hslen ||
        memcmp(ssl->in_msg + 6, "\0\0\0",        3) != 0 ||
        memcmp(ssl->in_msg + 9, ssl->in_msg + 1, 3) != 0) {
        return 1;
    }
    return 0;
}